

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MidiEventList.cpp
# Opt level: O1

int __thiscall smf::MidiEventList::push_back_no_copy(MidiEventList *this,MidiEvent *event)

{
  pointer *pppMVar1;
  iterator __position;
  MidiEvent *local_10;
  
  __position._M_current =
       (this->list).super__Vector_base<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (__position._M_current ==
      (this->list).super__Vector_base<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    local_10 = event;
    std::vector<smf::MidiEvent*,std::allocator<smf::MidiEvent*>>::
    _M_realloc_insert<smf::MidiEvent*const&>
              ((vector<smf::MidiEvent*,std::allocator<smf::MidiEvent*>> *)this,__position,&local_10)
    ;
  }
  else {
    *__position._M_current = event;
    pppMVar1 = &(this->list).super__Vector_base<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>
                ._M_impl.super__Vector_impl_data._M_finish;
    *pppMVar1 = *pppMVar1 + 1;
  }
  return (int)((ulong)((long)(this->list).
                             super__Vector_base<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>
                             ._M_impl.super__Vector_impl_data._M_finish -
                      (long)(this->list).
                            super__Vector_base<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>.
                            _M_impl.super__Vector_impl_data._M_start) >> 3) + -1;
}

Assistant:

int MidiEventList::push_back_no_copy(MidiEvent* event) {
	list.push_back(event);
	return (int)list.size()-1;
}